

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl_encoder.cc
# Opt level: O2

Status * __thiscall
draco::StlEncoder::EncodeToFile
          (Status *__return_storage_ptr__,StlEncoder *this,Mesh *mesh,string *file_name)

{
  EncoderBuffer buffer;
  allocator<char> local_59;
  undefined1 local_58 [8];
  undefined1 local_50 [48];
  
  this->in_mesh_ = mesh;
  FileWriterFactory::OpenWriter((string *)local_58);
  if (local_58 == (undefined1  [8])0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_50,"File couldn\'t be opened",&local_59);
    __return_storage_ptr__->code_ = IO_ERROR;
    std::__cxx11::string::string((string *)&__return_storage_ptr__->error_msg_,(string *)local_50);
    std::__cxx11::string::~string((string *)local_50);
  }
  else {
    EncoderBuffer::EncoderBuffer((EncoderBuffer *)local_50);
    EncodeToBuffer(__return_storage_ptr__,this,mesh,(EncoderBuffer *)local_50);
    if (__return_storage_ptr__->code_ == OK) {
      std::__cxx11::string::~string((string *)&__return_storage_ptr__->error_msg_);
      (**(code **)(*(long *)local_58 + 0x10))
                (local_58,local_50._0_8_,local_50._8_8_ - local_50._0_8_);
      __return_storage_ptr__->code_ = OK;
      (__return_storage_ptr__->error_msg_)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->error_msg_).field_2;
      (__return_storage_ptr__->error_msg_)._M_string_length = 0;
      (__return_storage_ptr__->error_msg_).field_2._M_local_buf[0] = '\0';
    }
    EncoderBuffer::~EncoderBuffer((EncoderBuffer *)local_50);
  }
  if (local_58 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_58 + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

Status StlEncoder::EncodeToFile(const Mesh &mesh,
                                const std::string &file_name) {
  in_mesh_ = &mesh;
  std::unique_ptr<FileWriterInterface> file =
      FileWriterFactory::OpenWriter(file_name);
  if (!file) {
    return Status(Status::IO_ERROR, "File couldn't be opened");
  }
  // Encode the mesh into a buffer.
  EncoderBuffer buffer;
  DRACO_RETURN_IF_ERROR(EncodeToBuffer(mesh, &buffer));
  // Write the buffer into the file.
  file->Write(buffer.data(), buffer.size());
  return OkStatus();
}